

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O0

nvlist_t * nvlist_clone(nvlist_t *nvl)

{
  int iVar1;
  int *piVar2;
  nvpair_t *nvp_00;
  nvpair_t *newnvp;
  nvpair_t *nvp;
  nvlist_t *newnvl;
  nvlist_t *nvl_local;
  
  if (nvl == (nvlist_t *)0x0) {
    __assert_fail("(nvl) != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0x17f,"nvlist_t *nvlist_clone(const nvlist_t *)");
  }
  if (nvl->nvl_magic == 0x6e766c) {
    if (nvl->nvl_error == 0) {
      nvl_local = nvlist_create(nvl->nvl_flags & 3);
      newnvp = nvlist_first_nvpair(nvl);
      while ((newnvp != (nvpair_t *)0x0 &&
             (nvp_00 = nvpair_clone(newnvp), nvp_00 != (nvpair_t *)0x0))) {
        nvlist_move_nvpair(nvl_local,nvp_00);
        newnvp = nvlist_next_nvpair(nvl,newnvp);
      }
      if (newnvp != (nvpair_t *)0x0) {
        nvlist_destroy(nvl_local);
        nvl_local = (nvlist_t *)0x0;
      }
    }
    else {
      iVar1 = nvl->nvl_error;
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      nvl_local = (nvlist_t *)0x0;
    }
    return nvl_local;
  }
  __assert_fail("(nvl)->nvl_magic == 0x6e766c",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0x17f,"nvlist_t *nvlist_clone(const nvlist_t *)");
}

Assistant:

nvlist_t *
nvlist_clone(const nvlist_t *nvl)
{
	nvlist_t *newnvl;
	nvpair_t *nvp, *newnvp;

	NVLIST_ASSERT(nvl);

	if (nvl->nvl_error != 0) {
		ERRNO_SET(nvl->nvl_error);
		return (NULL);
	}

	newnvl = nvlist_create(nvl->nvl_flags & NV_FLAG_PUBLIC_MASK);
	for (nvp = nvlist_first_nvpair(nvl); nvp != NULL;
	    nvp = nvlist_next_nvpair(nvl, nvp)) {
		newnvp = nvpair_clone(nvp);
		if (newnvp == NULL)
			break;
		(void)nvlist_move_nvpair(newnvl, newnvp);
	}
	if (nvp != NULL) {
		nvlist_destroy(newnvl);
		return (NULL);
	}
	return (newnvl);
}